

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_parse_l(archive_acl *acl,char *text,wchar_t default_type,archive_string_conv *sc
                           )

{
  wchar_t permset_00;
  byte *pbVar1;
  ulong uVar2;
  anon_struct_16_2_267fbce2 *paVar3;
  int iVar4;
  wchar_t wVar5;
  ulong uVar6;
  archive_acl_entry *paVar7;
  int *piVar8;
  anon_struct_16_2_267fbce2 *paVar9;
  char *end;
  ulong uVar10;
  byte *pbVar11;
  char *start;
  byte bVar12;
  ulong uVar13;
  byte *pbVar14;
  bool bVar15;
  undefined8 uStack_d0;
  wchar_t local_bc;
  char *local_b8;
  char *local_b0;
  wchar_t id;
  wchar_t permset;
  char *local_a0;
  char *local_98;
  wchar_t local_8c;
  undefined8 local_88;
  archive_acl *local_80;
  anon_struct_16_2_267fbce2 field [4];
  
  local_88 = 0;
  local_8c = default_type;
  local_80 = acl;
  do {
    if (((byte *)text == (byte *)0x0) || (*text == 0)) {
      return (wchar_t)local_88;
    }
    uVar13 = 0;
    uVar2 = 1;
    paVar3 = field + 1;
    do {
      while ((paVar9 = paVar3, uVar6 = uVar2, uVar10 = uVar13, uVar13 = (ulong)(byte)*text,
             pbVar14 = (byte *)text, uVar13 < 0x21 && ((0x100000600U >> (uVar13 & 0x3f) & 1) != 0)))
      {
        text = (char *)((byte *)text + 1);
        uVar13 = uVar10;
        uVar2 = uVar6;
        paVar3 = paVar9;
      }
      while ((bVar12 = (byte)uVar13, 0x3a < bVar12 ||
             (pbVar1 = pbVar14, (0x400100000000401U >> (uVar13 & 0x3f) & 1) == 0))) {
        uVar13 = (ulong)pbVar14[1];
        pbVar14 = pbVar14 + 1;
      }
      do {
        pbVar11 = pbVar1;
        if (0x20 < (ulong)pbVar11[-1]) break;
        pbVar1 = pbVar11 + -1;
      } while ((0x100000600U >> ((ulong)pbVar11[-1] & 0x3f) & 1) != 0);
      if (uVar10 < 4) {
        field[uVar10].start = text;
        field[uVar10].end = (char *)pbVar11;
      }
      text = (char *)(pbVar14 + (bVar12 != 0));
      uVar13 = uVar10 + 1;
      uVar2 = uVar6 + 1;
      paVar3 = paVar9 + 1;
    } while (bVar12 == 0x3a);
    text = (char *)(pbVar14 + (bVar12 != 0));
    for (; end = field[1].end, start = field[1].start, uVar6 < 4; uVar6 = uVar6 + 1) {
      paVar9->start = (char *)0x0;
      paVar9->end = (char *)0x0;
      paVar9 = paVar9 + 1;
    }
    id = L'\xffffffff';
    local_b8 = field[1].start;
    local_b0 = field[1].end;
    isint(field[1].start,field[1].end,&id);
    if (2 < uVar10 && id == L'\xffffffff') {
      isint(field[3].start,field[3].end,&id);
    }
    local_98 = field[0].end;
    if ((long)field[0].end - (long)field[0].start < 8) {
      local_bc = local_8c;
      local_a0 = field[0].start;
    }
    else {
      local_a0 = field[0].start;
      iVar4 = bcmp(field[0].start,"default",7);
      if (iVar4 == 0) {
        local_a0 = local_a0 + 7;
        local_bc = L'Ȁ';
        field[0].start = local_a0;
      }
      else {
        local_bc = local_8c;
      }
    }
    wVar5 = prefix_c(local_a0,local_98,"user");
    if (wVar5 == L'\0') {
      wVar5 = prefix_c(local_a0,local_98,"group");
      if (wVar5 == L'\0') {
        wVar5 = prefix_c(local_a0,local_98,"other");
        iVar4 = (int)uVar10;
        if (wVar5 == L'\0') {
          wVar5 = prefix_c(local_a0,local_98,"mask");
          if (wVar5 == L'\0') {
            return L'\xffffffec';
          }
          if (iVar4 == 2) {
            bVar15 = start != end;
            end = field[2].end;
            start = field[2].start;
            if (bVar15) {
              return L'\xffffffec';
            }
          }
          else if (iVar4 != 1) {
            return L'\xffffffec';
          }
          if (end <= start) {
            return L'\xffffffec';
          }
          wVar5 = ismode(start,end,&permset);
          if (wVar5 == L'\0') {
            return L'\xffffffec';
          }
          wVar5 = L'✕';
        }
        else {
          if (iVar4 == 2) {
            bVar15 = start != end;
            end = field[2].end;
            start = field[2].start;
            if (bVar15) {
              return L'\xffffffec';
            }
          }
          else if (iVar4 != 1) {
            return L'\xffffffec';
          }
          if (end <= start) {
            return L'\xffffffec';
          }
          wVar5 = ismode(start,end,&permset);
          if (wVar5 == L'\0') {
            return L'\xffffffec';
          }
          wVar5 = L'✖';
        }
      }
      else {
        wVar5 = ismode(field[2].start,field[2].end,&permset);
        if (wVar5 == L'\0') {
          return L'\xffffffec';
        }
        if ((start < end) || (id != L'\xffffffff')) {
          wVar5 = L'✓';
          goto LAB_00416332;
        }
        wVar5 = L'✔';
      }
LAB_00416320:
      local_b0 = (char *)0x0;
      local_b8 = (char *)0x0;
    }
    else {
      wVar5 = ismode(field[2].start,field[2].end,&permset);
      if (wVar5 == L'\0') {
        return L'\xffffffec';
      }
      if ((end <= start) && (id == L'\xffffffff')) {
        wVar5 = L'✒';
        goto LAB_00416320;
      }
      wVar5 = L'✑';
    }
LAB_00416332:
    permset_00 = permset;
    local_98 = (char *)CONCAT44(local_98._4_4_,id);
    local_a0 = (char *)CONCAT44(local_a0._4_4_,wVar5);
    wVar5 = acl_special(local_80,local_bc,permset,wVar5);
    if (wVar5 != L'\0') {
      paVar7 = acl_new_entry(local_80,local_bc,permset_00,(wchar_t)local_a0,(wchar_t)local_98);
      if (paVar7 == (archive_acl_entry *)0x0) {
        return L'\xffffffe7';
      }
      if (((local_b8 == (char *)0x0) || (local_b0 == local_b8)) || (*local_b8 == '\0')) {
        archive_mstring_clean(&paVar7->name);
      }
      else {
        wVar5 = archive_mstring_copy_mbs_len_l
                          (&paVar7->name,local_b8,(long)local_b0 - (long)local_b8,sc);
        if (wVar5 != L'\0') {
          piVar8 = __errno_location();
          text = (char *)(pbVar14 + (bVar12 != 0));
          uStack_d0 = 0xffffffffffffffec;
          local_88 = uStack_d0;
          if (*piVar8 == 0xc) {
            return L'\xffffffe2';
          }
        }
      }
    }
  } while( true );
}

Assistant:

int
archive_acl_parse_l(struct archive_acl *acl,
    const char *text, int default_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[4], name;

	int fields, n, r, ret = ARCHIVE_OK;
	int type, tag, permset, id;
	char sep;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && memcmp(field[0].start, "default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_c(field[0].start, field[0].end, "user")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "group")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_c(field[0].start, field[0].end, "mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
	}
	return (ret);
}